

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase * AnalyzeShortFunctionDefinition(ExpressionContext *ctx,SynShortFunctionDefinition *syntax)

{
  IntrusiveList<TypeHandle> arguments_00;
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  TypeFunction *argumentType;
  ExprBase *pEVar3;
  uint i;
  uint uVar4;
  IntrusiveList<TypeHandle> arguments;
  TypeHandle *node;
  
  arguments.head = (TypeHandle *)0x0;
  arguments.tail = (TypeHandle *)0x0;
  uVar4 = 0;
  while( true ) {
    uVar1 = IntrusiveList<SynShortFunctionArgument>::size(&syntax->arguments);
    if (uVar1 <= uVar4) break;
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
    node = (TypeHandle *)CONCAT44(extraout_var,iVar2);
    node->type = ctx->typeGeneric;
    node->next = (TypeHandle *)0x0;
    node->listed = false;
    IntrusiveList<TypeHandle>::push_back(&arguments,node);
    uVar4 = uVar4 + 1;
  }
  arguments_00.tail = arguments.tail;
  arguments_00.head = arguments.head;
  argumentType = ExpressionContext::GetFunctionType
                           (ctx,&syntax->super_SynBase,ctx->typeGeneric,arguments_00);
  pEVar3 = AnalyzeShortFunctionDefinition(ctx,syntax,(FunctionData *)0x0,argumentType);
  return pEVar3;
}

Assistant:

ExprBase* AnalyzeShortFunctionDefinition(ExpressionContext &ctx, SynShortFunctionDefinition *syntax)
{
	IntrusiveList<TypeHandle> arguments;

	for(unsigned i = 0; i < syntax->arguments.size(); i++)
		arguments.push_back(new (ctx.get<TypeHandle>()) TypeHandle(ctx.typeGeneric));

	TypeFunction *typeFunction = ctx.GetFunctionType(syntax, ctx.typeGeneric, arguments);

	return AnalyzeShortFunctionDefinition(ctx, syntax, NULL, typeFunction);
}